

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

bool __thiscall
wallet::DescriptorScriptPubKeyMan::SetupDescriptorGeneration
          (DescriptorScriptPubKeyMan *this,WalletBatch *batch,CExtKey *master_key,
          OutputType addr_type,bool internal)

{
  WalletStorage *pWVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  runtime_error *prVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock62;
  OutputType local_1b4;
  unique_lock<std::recursive_mutex> local_1b0;
  CExtPubKey local_1a0;
  undefined1 local_128 [16];
  element_type local_118;
  uchar auStack_110 [4];
  uchar auStack_10c [4];
  uchar local_108 [4];
  uchar auStack_104 [4];
  uchar auStack_100 [4];
  uchar auStack_fc [4];
  uchar local_f8 [4];
  uchar auStack_f4 [4];
  int32_t iStack_f0;
  int32_t iStack_ec;
  int32_t local_e8;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_e0;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_a8;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_1b0._M_device = &(this->cs_desc_man).super_recursive_mutex;
  local_1b0._M_owns = false;
  local_1b4 = addr_type;
  std::unique_lock<std::recursive_mutex>::lock(&local_1b0);
  pWVar1 = (this->super_ScriptPubKeyMan).m_storage;
  iVar6 = (*pWVar1->_vptr_WalletStorage[4])(pWVar1,0x400000000);
  if ((char)iVar6 == '\0') {
    __assert_fail("m_storage.IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS)",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                  ,0x92d,
                  "bool wallet::DescriptorScriptPubKeyMan::SetupDescriptorGeneration(WalletBatch &, const CExtKey &, OutputType, bool)"
                 );
  }
  peVar2 = (this->m_wallet_descriptor).descriptor.
           super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2 == (element_type *)0x0) {
    CExtKey::Neuter(&local_1a0,master_key);
    GenerateWalletDescriptor((WalletDescriptor *)local_128,&local_1a0,&local_1b4,internal);
    uVar4 = local_128._8_8_;
    uVar3 = local_128._0_8_;
    local_128._0_8_ = (element_type *)0x0;
    local_128._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (this->m_wallet_descriptor).descriptor.
              super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (this->m_wallet_descriptor).descriptor.
    super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)uVar3;
    (this->m_wallet_descriptor).descriptor.
    super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    (this->m_wallet_descriptor).next_index = local_e8;
    *(uchar (*) [4])&(this->m_wallet_descriptor).creation_time = local_f8;
    *(uchar (*) [4])((long)&(this->m_wallet_descriptor).creation_time + 4) = auStack_f4;
    (this->m_wallet_descriptor).range_start = iStack_f0;
    (this->m_wallet_descriptor).range_end = iStack_ec;
    *(uchar (*) [4])((this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems + 0x10) =
         local_108;
    *(uchar (*) [4])((this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems + 0x14) =
         auStack_104;
    *(uchar (*) [4])((this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems + 0x18) =
         auStack_100;
    *(uchar (*) [4])((this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems + 0x1c) =
         auStack_fc;
    *(undefined4 *)(this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems =
         local_118._vptr_Descriptor._0_4_;
    *(undefined4 *)((this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems + 4) =
         local_118._vptr_Descriptor._4_4_;
    *(uchar (*) [4])((this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems + 8) =
         auStack_110;
    *(uchar (*) [4])((this->m_wallet_descriptor).id.super_base_blob<256U>.m_data._M_elems + 0xc) =
         auStack_10c;
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_move_assign((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)&(this->m_wallet_descriptor).cache,&local_e0);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_move_assign(&(this->m_wallet_descriptor).cache.m_parent_xpubs._M_h,&local_a8);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_move_assign(&(this->m_wallet_descriptor).cache.m_last_hardened_xpubs._M_h,&local_70);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_70);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_a8);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_e0);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_);
    }
    CKey::GetPubKey((CPubKey *)local_128,&master_key->key);
    bVar5 = AddDescriptorKeyWithDB(this,batch,&master_key->key,(CPubKey *)local_128);
    if (!bVar5) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_1a0._0_8_ = (long)&local_1a0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1a0,"SetupDescriptorGeneration","");
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_1a0,": writing descriptor master private key failed");
      local_128._0_8_ = (pbVar8->_M_dataplus)._M_p;
      paVar9 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._0_8_ == paVar9) {
        local_118._vptr_Descriptor = (_func_int **)paVar9->_M_allocated_capacity;
        _auStack_110 = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_128._0_8_ = &local_118;
      }
      else {
        local_118._vptr_Descriptor = (_func_int **)paVar9->_M_allocated_capacity;
      }
      local_128._8_8_ = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar9;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      std::runtime_error::runtime_error(prVar7,(string *)local_128);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_004f1c84;
    }
    (*(this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1a])(local_128,this);
    bVar5 = WalletBatch::WriteDescriptor(batch,(uint256 *)local_128,&this->m_wallet_descriptor);
    if (!bVar5) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_1a0._0_8_ = (long)&local_1a0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1a0,"SetupDescriptorGeneration","");
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_1a0,": writing descriptor failed");
      local_128._0_8_ = (pbVar8->_M_dataplus)._M_p;
      paVar9 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._0_8_ == paVar9) {
        local_118._vptr_Descriptor = (_func_int **)paVar9->_M_allocated_capacity;
        _auStack_110 = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_128._0_8_ = &local_118;
      }
      else {
        local_118._vptr_Descriptor = (_func_int **)paVar9->_M_allocated_capacity;
      }
      local_128._8_8_ = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar9;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      std::runtime_error::runtime_error(prVar7,(string *)local_128);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_004f1c84;
    }
    TopUpWithDB(this,batch,0);
    pWVar1 = (this->super_ScriptPubKeyMan).m_storage;
    (*pWVar1->_vptr_WalletStorage[5])(pWVar1,batch);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_1b0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return peVar2 == (element_type *)0x0;
  }
LAB_004f1c84:
  __stack_chk_fail();
}

Assistant:

bool DescriptorScriptPubKeyMan::SetupDescriptorGeneration(WalletBatch& batch, const CExtKey& master_key, OutputType addr_type, bool internal)
{
    LOCK(cs_desc_man);
    assert(m_storage.IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS));

    // Ignore when there is already a descriptor
    if (m_wallet_descriptor.descriptor) {
        return false;
    }

    m_wallet_descriptor = GenerateWalletDescriptor(master_key.Neuter(), addr_type, internal);

    // Store the master private key, and descriptor
    if (!AddDescriptorKeyWithDB(batch, master_key.key, master_key.key.GetPubKey())) {
        throw std::runtime_error(std::string(__func__) + ": writing descriptor master private key failed");
    }
    if (!batch.WriteDescriptor(GetID(), m_wallet_descriptor)) {
        throw std::runtime_error(std::string(__func__) + ": writing descriptor failed");
    }

    // TopUp
    TopUpWithDB(batch);

    m_storage.UnsetBlankWalletFlag(batch);
    return true;
}